

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modules.cpp
# Opt level: O0

void module2(uint W)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  Task *pTVar2;
  Expression_lhs<const_int_&> *this;
  FlowBuilder *this_00;
  double __x;
  double __x_00;
  Expression_lhs<const_int_&> EVar3;
  ResultBuilder DOCTEST_RB_1;
  int n_1;
  ResultBuilder DOCTEST_RB;
  int n;
  Task m2_2;
  Task m2_1;
  Taskflow f2;
  Task m1_2;
  Task m1_1;
  Taskflow f1;
  Task E;
  Task D;
  Task C;
  Task B;
  Task A;
  Taskflow f0;
  int cnt;
  Executor executor;
  string *in_stack_fffffffffffff788;
  Result *pRVar4;
  Taskflow *in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff798;
  int in_stack_fffffffffffff79c;
  Taskflow *in_stack_fffffffffffff7a0;
  undefined4 in_stack_fffffffffffff7a8;
  Enum in_stack_fffffffffffff7ac;
  Taskflow *in_stack_fffffffffffff7b0;
  allocator<char> *in_stack_fffffffffffff7c0;
  Executor *this_01;
  char *in_stack_fffffffffffff7c8;
  Taskflow *in_stack_fffffffffffff7d0;
  Taskflow *object;
  FlowBuilder *in_stack_fffffffffffff7d8;
  allocator<char> *rhs;
  ExpressionDecomposer local_78c;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffff878;
  undefined4 in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff884;
  Executor *in_stack_fffffffffffff888;
  ResultBuilder local_758;
  int local_6c0;
  int local_6bc;
  Taskflow *local_6b8;
  Enum local_6b0;
  ExpressionDecomposer local_6a4;
  Taskflow *local_6a0;
  Enum local_698;
  ResultBuilder local_670;
  int local_5d8;
  undefined1 local_5d1 [41];
  Task local_5a8;
  undefined1 local_599 [41];
  Task local_570 [26];
  allocator<char> local_499;
  string local_498 [40];
  Task local_470;
  allocator<char> local_461;
  string local_460 [40];
  Task local_438 [26];
  allocator<char> local_361;
  string local_360 [32];
  undefined4 *local_340;
  Task local_330;
  allocator<char> local_321;
  string local_320 [32];
  undefined4 *local_300;
  Task local_2f0;
  allocator<char> local_2e1;
  string local_2e0 [32];
  undefined4 *local_2c0;
  Task local_2b0;
  allocator<char> local_2a1;
  string local_2a0 [32];
  undefined4 *local_280;
  Task local_270;
  allocator<char> local_261;
  string local_260 [32];
  undefined4 *local_240;
  Task local_230 [26];
  undefined4 local_160 [88];
  
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffff790,in_stack_fffffffffffff788)
  ;
  tf::Executor::Executor
            (in_stack_fffffffffffff888,CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880)
             ,in_stack_fffffffffffff878);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x1180a2);
  local_160[0] = 0;
  tf::Taskflow::Taskflow(in_stack_fffffffffffff7b0);
  local_240 = local_160;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:118:23),_nullptr>
            (in_stack_fffffffffffff7d8,(anon_class_8_1_ba1d3cc9 *)in_stack_fffffffffffff7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
  pTVar2 = tf::Task::name((Task *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  tf::Task::Task(local_230,pTVar2);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  local_280 = local_160;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:119:23),_nullptr>
            (in_stack_fffffffffffff7d8,(anon_class_8_1_ba1d3cc9 *)in_stack_fffffffffffff7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
  pTVar2 = tf::Task::name((Task *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  tf::Task::Task(&local_270,pTVar2);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  local_2c0 = local_160;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:120:23),_nullptr>
            (in_stack_fffffffffffff7d8,(anon_class_8_1_ba1d3cc9 *)in_stack_fffffffffffff7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
  this = (Expression_lhs<const_int_&> *)
         tf::Task::name((Task *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  tf::Task::Task(&local_2b0,(Task *)this);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  local_300 = local_160;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:121:23),_nullptr>
            (in_stack_fffffffffffff7d8,(anon_class_8_1_ba1d3cc9 *)in_stack_fffffffffffff7d0);
  rhs = &local_321;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
  pTVar2 = tf::Task::name((Task *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  tf::Task::Task(&local_2f0,pTVar2);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  local_340 = local_160;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_modules_cpp:122:23),_nullptr>
            (in_stack_fffffffffffff7d8,(anon_class_8_1_ba1d3cc9 *)in_stack_fffffffffffff7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
  pTVar2 = tf::Task::name((Task *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  tf::Task::Task(&local_330,pTVar2);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff790,(Task *)in_stack_fffffffffffff788);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff790,(Task *)in_stack_fffffffffffff788);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff790,(Task *)in_stack_fffffffffffff788);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff790,(Task *)in_stack_fffffffffffff788);
  tf::Taskflow::Taskflow(in_stack_fffffffffffff7b0);
  tf::FlowBuilder::composed_of<tf::Taskflow>(in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
  pTVar2 = tf::Task::name((Task *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  tf::Task::Task(local_438,pTVar2);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  tf::FlowBuilder::composed_of<tf::Taskflow>(in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
  this_00 = (FlowBuilder *)
            tf::Task::name((Task *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  tf::Task::Task(&local_470,(Task *)this_00);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator(&local_499);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff790,(Task *)in_stack_fffffffffffff788);
  tf::Taskflow::Taskflow(in_stack_fffffffffffff7b0);
  tf::FlowBuilder::composed_of<tf::Taskflow>(this_00,in_stack_fffffffffffff7d0);
  object = (Taskflow *)local_599;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,
             in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
  pTVar2 = tf::Task::name((Task *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  tf::Task::Task(local_570,pTVar2);
  std::__cxx11::string::~string((string *)(local_599 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_599);
  tf::FlowBuilder::composed_of<tf::Taskflow>(this_00,object);
  this_01 = (Executor *)local_5d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,
             (char *)pTVar2,(allocator<char> *)this_01);
  pTVar2 = tf::Task::name((Task *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  tf::Task::Task(&local_5a8,pTVar2);
  std::__cxx11::string::~string((string *)(local_5d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_5d1);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff790,(Task *)in_stack_fffffffffffff788);
  for (local_5d8 = 0; local_5d8 < 100; local_5d8 = local_5d8 + 1) {
    local_160[0] = 0;
    tf::Executor::run_n((Executor *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                        in_stack_fffffffffffff7a0,
                        CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    std::future<void>::get((future<void> *)in_stack_fffffffffffff7a0);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffff790);
    pRVar4 = (Result *)0x19c880;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
               (char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
               (char *)in_stack_fffffffffffff790,"",(char *)this_01);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_6a4,DT_REQUIRE);
    EVar3 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                      ((ExpressionDecomposer *)in_stack_fffffffffffff790,(int *)pRVar4);
    in_stack_fffffffffffff7b0 = (Taskflow *)EVar3.lhs;
    in_stack_fffffffffffff7ac = EVar3.m_at;
    local_6bc = local_5d8 * 0x14;
    local_6b8 = in_stack_fffffffffffff7b0;
    local_6b0 = in_stack_fffffffffffff7ac;
    local_6a0 = in_stack_fffffffffffff7b0;
    local_698 = in_stack_fffffffffffff7ac;
    doctest::detail::Expression_lhs<int_const&>::operator==(this,(int *)rhs);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffff790,pRVar4);
    doctest::detail::Result::~Result((Result *)0x118888);
    doctest::detail::ResultBuilder::log(&local_670,__x);
    in_stack_fffffffffffff7a8 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffff7a8);
    if ((extraout_AL & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff790);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x118c99);
  }
  local_160[0] = 0;
  for (local_6c0 = 0; local_6c0 < 100; local_6c0 = local_6c0 + 1) {
    tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                      in_stack_fffffffffffff790);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffff790);
  }
  tf::Executor::wait_for_all(this_01);
  pRVar4 = (Result *)0x19c880;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
             (char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
             (char *)in_stack_fffffffffffff790,"",(char *)this_01);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_78c,DT_REQUIRE);
  doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
            ((ExpressionDecomposer *)in_stack_fffffffffffff790,(int *)pRVar4);
  doctest::detail::Expression_lhs<int_const&>::operator==(this,(int *)rhs);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffff790,pRVar4);
  doctest::detail::Result::~Result((Result *)0x118e21);
  doctest::detail::ResultBuilder::log(&local_758,__x_00);
  if ((extraout_AL_00 & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff790);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x118eee);
    tf::Taskflow::~Taskflow(in_stack_fffffffffffff790);
    tf::Taskflow::~Taskflow(in_stack_fffffffffffff790);
    tf::Taskflow::~Taskflow(in_stack_fffffffffffff790);
    tf::Executor::~Executor(this_01);
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void module2(unsigned W) {

  tf::Executor executor(W);

  int cnt {0};

  // level 0 (+5)
  tf::Taskflow f0;

  auto A = f0.emplace([&cnt](){ ++cnt; }).name("f0A");
  auto B = f0.emplace([&cnt](){ ++cnt; }).name("f0B");
  auto C = f0.emplace([&cnt](){ ++cnt; }).name("f0C");
  auto D = f0.emplace([&cnt](){ ++cnt; }).name("f0D");
  auto E = f0.emplace([&cnt](){ ++cnt; }).name("f0E");

  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);

  // level 1 (+10)
  tf::Taskflow f1;
  auto m1_1 = f1.composed_of(f0).name("m1_1");
  auto m1_2 = f1.composed_of(f0).name("m1_2");
  m1_1.precede(m1_2);

  // level 2 (+20)
  tf::Taskflow f2;
  auto m2_1 = f2.composed_of(f1).name("m2_1");
  auto m2_2 = f2.composed_of(f1).name("m2_2");
  m2_1.precede(m2_2);

  //f2.dump(std::cout);

  // synchronous run
  for(int n=0; n<100; n++) {
    cnt = 0;
    executor.run_n(f2, n).get();
    REQUIRE(cnt == 20*n);
  }

  // asynchronous run
  cnt = 0;
  for(int n=0; n<100; n++) {
    executor.run(f2);
  }
  executor.wait_for_all();
  REQUIRE(cnt == 100*20);
 
}